

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O1

void __thiscall
nuraft::raft_server::handle_install_snapshot_resp_new_member(raft_server *this,resp_msg *resp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  type tVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  peer *ppVar8;
  bool bVar9;
  ptr<snapshot_sync_ctx> sync_ctx;
  string local_58;
  snapshot_sync_ctx *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      return;
    }
    iVar7 = (*peVar3->_vptr_logger[7])();
    if (iVar7 < 4) {
      return;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_(&local_58,"no server to join, the response must be very old.");
    (*peVar3->_vptr_logger[8])
              (peVar3,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp_new_member",0x195,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return;
    }
    operator_delete(local_58._M_dataplus._M_p);
    return;
  }
  if (resp->accepted_ == false) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar7 = (*peVar3->_vptr_logger[7])(), 2 < iVar7)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_58,
                 "peer doesn\'t accept the snapshot installation request, next log idx %lu, but we can move forward"
                 ,resp->next_idx_);
      (*peVar3->_vptr_logger[8])
                (peVar3,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x19d,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    LOCK();
    (((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    next_log_idx_).super___atomic_base<unsigned_long>._M_i = resp->next_idx_;
    UNLOCK();
  }
  timer_helper::reset(&((this->srv_to_join_).
                        super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       last_resp_timer_);
  ppVar8 = (peer *)&stack0xffffffffffffffc8;
  peer::get_snapshot_sync_ctx(ppVar8);
  if (local_38 == (snapshot_sync_ctx *)0x0) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar7 = (*peVar3->_vptr_logger[7])(), 0 < iVar7)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_58,
                 "SnapshotSyncContext must not be null: src %d dst %d my id %d leader id %d, maybe leader election happened in the meantime. next heartbeat or append request will cover it up."
                 ,(ulong)(uint)(resp->super_msg_base).src_,(ulong)(uint)(resp->super_msg_base).dst_,
                 (ulong)(uint)this->id_,(ulong)(uint)(this->leader_).super___atomic_base<int>._M_i);
      (*peVar3->_vptr_logger[8])
                (peVar3,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1a8,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    goto LAB_00228d58;
  }
  peVar4 = (local_38->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (local_38->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  tVar2 = peVar4->type_;
  if (tVar2 == logical_object) {
    peVar5 = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ppVar8 = (peer *)(resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    if (ppVar8 != (peer *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(ppVar8->config_).
                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &(ppVar8->config_).
                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    bVar9 = peVar5 != (element_type *)0x0;
    bVar6 = false;
  }
  else if (tVar2 == raw_binary) {
    bVar6 = true;
    if (resp->next_idx_ < peVar4->size_) {
      bVar9 = false;
    }
    else {
      bVar9 = true;
    }
  }
  else {
    bVar9 = false;
    bVar6 = true;
  }
  if (ppVar8 != (peer *)0x0 && !bVar6) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar8);
  }
  if (bVar9) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar7 = (*peVar3->_vptr_logger[7])(), 3 < iVar7)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_58,"snapshot install is done\n");
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1b5,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    LOCK();
    (((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    next_log_idx_).super___atomic_base<unsigned_long>._M_i =
         ((local_38->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->last_log_idx_ + 1;
    UNLOCK();
    ppVar8 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ppVar8->matched_idx_ =
         ((local_38->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->last_log_idx_;
    clear_snapshot_sync_ctx(this,ppVar8);
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar7 = (*peVar3->_vptr_logger[7])(), 3 < iVar7)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_58,
                 "snapshot has been copied and applied to new server, continue to sync logs after snapshot, next log idx %lu, matched idx %lu"
                 ,(((this->srv_to_join_).
                    super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  next_log_idx_).super___atomic_base<unsigned_long>._M_i,
                 ((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->matched_idx_);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1c1,&local_58);
LAB_00228d25:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
  }
  else {
    snapshot_sync_ctx::set_offset(local_38,resp->next_idx_);
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar7 = (*peVar3->_vptr_logger[7])(), 4 < iVar7)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_58,"continue to send snapshot to new server at offset %lu",resp->next_idx_);
      (*peVar3->_vptr_logger[8])
                (peVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1c5,&local_58);
      goto LAB_00228d25;
    }
  }
  sync_log_to_new_srv(this,(((this->srv_to_join_).
                             super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           next_log_idx_).super___atomic_base<unsigned_long>._M_i);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_00228d58:
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp_new_member(resp_msg& resp) {
    if (!srv_to_join_) {
        p_in("no server to join, the response must be very old.");
        return;
    }

    if (!resp.get_accepted()) {
        p_wn("peer doesn't accept the snapshot installation request, "
             "next log idx %" PRIu64 ", "
             "but we can move forward",
             resp.get_next_idx());
        srv_to_join_->set_next_log_idx(resp.get_next_idx());
    }
    srv_to_join_->reset_resp_timer();

    ptr<snapshot_sync_ctx> sync_ctx = srv_to_join_->get_snapshot_sync_ctx();
    if (sync_ctx == nullptr) {
        p_ft("SnapshotSyncContext must not be null: "
             "src %d dst %d my id %d leader id %d, "
             "maybe leader election happened in the meantime. "
             "next heartbeat or append request will cover it up.",
             resp.get_src(), resp.get_dst(), id_, leader_.load());
        return;
    }

    ptr<snapshot> snp = sync_ctx->get_snapshot();
    bool snp_install_done =
        ( snp->get_type() == snapshot::raw_binary &&
          resp.get_next_idx() >= snp->size() )         ||
        ( snp->get_type() == snapshot::logical_object &&
          resp.get_ctx() );

    if (snp_install_done) {
        // snapshot is done
        p_in("snapshot install is done\n");
        srv_to_join_->set_next_log_idx
            ( sync_ctx->get_snapshot()->get_last_log_idx() + 1 );
        srv_to_join_->set_matched_idx
            ( sync_ctx->get_snapshot()->get_last_log_idx() );

        clear_snapshot_sync_ctx(*srv_to_join_);

        p_in( "snapshot has been copied and applied to new server, "
              "continue to sync logs after snapshot, "
              "next log idx %" PRIu64 ", matched idx %" PRIu64 "",
              srv_to_join_->get_next_log_idx(),
              srv_to_join_->get_matched_idx() );
    } else {
        sync_ctx->set_offset(resp.get_next_idx());
        p_db( "continue to send snapshot to new server at offset %" PRIu64 "",
              resp.get_next_idx() );
    }

    sync_log_to_new_srv(srv_to_join_->get_next_log_idx());
}